

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

BOOL swamp_cave_in(dw_map *map,uint8_t warp_index)

{
  uint8_t uVar1;
  undefined3 in_register_00000031;
  
  uVar1 = map->warps_to[CONCAT31(in_register_00000031,warp_index)].map;
  return (BOOL)(map->warps_from[7].map == uVar1 || map->warps_from[5].map == uVar1);
}

Assistant:

static BOOL swamp_cave_in(dw_map *map, uint8_t warp_index)
{
    int warp_to;
    uint8_t swamp_north, swamp_south;

    swamp_north = map->warps_from[WARP_SWAMP_NORTH].map;
    swamp_south = map->warps_from[WARP_SWAMP_SOUTH].map;
    warp_to = map->warps_to[warp_index].map;

    return (swamp_north == warp_to || swamp_south == warp_to);
}